

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

void capnp::compiler::anon_unknown_0::checkExampleValue
               (Reader *value,uint ordinal,Reader type,uint sharedOrdinalCount)

{
  double dVar1;
  Reader type_00;
  Reader type_01;
  Field field_00;
  Field field_01;
  undefined8 uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ReaderFor<bool> RVar5;
  int8_t iVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int32_t iVar10;
  uint sharedOrdinalCount_01;
  uint sharedOrdinalCount_00;
  uint *params;
  Schema __s2;
  char *ptrCopy;
  bool bVar11;
  undefined4 uVar12;
  StringPtr name;
  StringPtr name_00;
  ReaderFor<Text> RVar13;
  ReaderFor<DynamicEnum> RVar14;
  Field field;
  Fault f;
  StructSchema structType;
  Fault f_1;
  ReaderFor<capnp::DynamicStruct> structValue;
  uint local_25c;
  char *local_258;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_250;
  PointerReader local_208;
  byte *local_1e1;
  undefined8 uStack_1c9;
  StructSchema local_1c0;
  long local_1b8;
  byte *local_198;
  undefined8 uStack_180;
  PointerReader local_178;
  StructReader local_150;
  StructReader local_120;
  Reader local_f0;
  Reader local_a8;
  ReaderFor<DynamicStruct> local_60;
  
  local_25c = ordinal;
  if (type._reader.dataSize < 0x10) {
switchD_001515f4_caseD_3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x226,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal((Fault *)&local_258);
  }
  switch(*type._reader.data) {
  case 1:
    RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    if (RVar5 == (ReaderFor<bool>)((byte)ordinal & 1)) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 2:
    iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(value);
    if ((ordinal & 0xff) - 0x80 != (int)iVar6) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  default:
    goto switchD_001515f4_caseD_3;
  case 4:
    iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(value);
    if (iVar10 != ordinal * 0xb8df) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 7:
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(value);
    if (ordinal * 0xd != (uint)uVar7) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xb:
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
    if ((dVar1 != (double)ordinal * 313.25) || (NAN(dVar1) || NAN((double)ordinal * 313.25))) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xc:
    RVar13 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    params = RVar13.super_StringPtr.content.size_;
    kj::str<unsigned_int&>((String *)&local_258,(kj *)&local_25c,params);
    uVar2 = aStack_250.intValue;
    pcVar4 = local_258;
    if (params == (uint *)(aStack_250.textValue.super_StringPtr.content.ptr +
                          (aStack_250._0_8_ == (Schema)0x0))) {
      __s2.raw = (RawBrandedSchema *)0x1dcce1;
      if (aStack_250._0_8_ != (Schema)0x0) {
        __s2.raw = (RawBrandedSchema *)local_258;
      }
      iVar9 = bcmp(RVar13.super_StringPtr.content.ptr,__s2.raw,(long)params - 1);
      bVar11 = iVar9 == 0;
    }
    else {
      bVar11 = false;
    }
    if ((RawBrandedSchema *)local_258 != (RawBrandedSchema *)0x0) {
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      puVar3 = (undefined8 *)
               CONCAT44(aStack_250.textValue.super_StringPtr.content.size_._4_4_,
                        CONCAT22(aStack_250.textValue.super_StringPtr.content.size_._2_2_,
                                 aStack_250.enumValue.value));
      (**(code **)*puVar3)(puVar3,pcVar4,1,uVar2,uVar2,0);
    }
    if (!bVar11) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xe:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_258,value);
    DynamicList::Reader::operator[](&local_f0,(ReaderFor<DynamicList> *)&local_258,0);
    bVar11 = type._reader.pointerCount == 0;
    if (bVar11) {
      type._reader.pointers = (WirePointer *)0x0;
    }
    local_208.nestingLimit = 0x7fffffff;
    if (!bVar11) {
      local_208.nestingLimit = type._reader.nestingLimit;
    }
    local_208.segment._0_4_ = 0;
    local_208.segment._4_4_ = 0;
    uVar12 = 0;
    local_208.capTable._4_4_ = 0;
    if (!bVar11) {
      local_208.segment._0_4_ = type._reader.segment._0_4_;
      local_208.segment._4_4_ = type._reader.segment._4_4_;
      uVar12 = type._reader.capTable._0_4_;
      local_208.capTable._4_4_ = type._reader.capTable._4_4_;
    }
    local_208.capTable._0_2_ = (uint16_t)uVar12;
    local_208.capTable._2_2_ = (undefined2)((uint)uVar12 >> 0x10);
    local_208.pointer._0_7_ = SUB87(type._reader.pointers,0);
    local_208.pointer._7_1_ = (undefined1)((ulong)type._reader.pointers >> 0x38);
    _::PointerReader::getStruct(&local_150,&local_208,(word *)0x0);
    type_00._reader.capTable = local_150.capTable;
    type_00._reader.segment = local_150.segment;
    type_00._reader.data = local_150.data;
    type_00._reader.pointers = local_150.pointers;
    type_00._reader.dataSize = local_150.dataSize;
    type_00._reader.pointerCount = local_150.pointerCount;
    type_00._reader._38_2_ = local_150._38_2_;
    type_00._reader.nestingLimit = local_150.nestingLimit;
    type_00._reader._44_4_ = local_150._44_4_;
    checkExampleValue(&local_f0,ordinal,type_00,sharedOrdinalCount_00);
    DynamicValue::Reader::~Reader(&local_f0);
    break;
  case 0xf:
    RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    local_208.segment._0_4_ = RVar14.schema.super_Schema.raw._0_4_;
    local_208.segment._4_4_ = RVar14.schema.super_Schema.raw._4_4_;
    local_208.capTable._0_2_ = RVar14.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&local_258,(DynamicEnum *)&local_208);
    if (local_258._0_1_ != true) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    local_208.segment._0_4_ = (undefined4)aStack_250.intValue;
    local_208.segment._4_4_ = (undefined4)((ulong)aStack_250._0_8_ >> 0x20);
    EnumSchema::getEnumerants((EnumerantList *)&local_258,(EnumSchema *)&local_208);
    if (ordinal % (uint)aStack_250.anyPointerValue.reader.nestingLimit !=
        (uint)aStack_250.enumValue.value) {
      local_208.segment._0_4_ = 0;
      local_208.segment._4_4_ = 0;
      local_258 = (char *)0x0;
      aStack_250.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0x10:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_60,value);
    local_1c0.super_Schema.raw = local_60.schema.super_Schema.raw;
    name.content.size_ = 2;
    name.content.ptr = "i";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_258,&local_1c0,name);
    if (local_258._0_1_ == true) {
      uVar2 = CONCAT44(aStack_250.textValue.super_StringPtr.content.size_._4_4_,
                       CONCAT22(aStack_250.textValue.super_StringPtr.content.size_._2_2_,
                                aStack_250.enumValue.value));
      field_00.proto._reader.capTable._4_4_ = aStack_250._28_4_;
      field_00.proto._reader.capTable._0_4_ = aStack_250.anyPointerValue.reader.nestingLimit;
      field_00.proto._reader.pointers._4_2_ = aStack_250.structValue.reader.pointerCount;
      field_00.proto._reader.pointers._0_4_ = aStack_250.listValue.reader.elementCount;
      field_00.proto._reader.pointers._6_2_ = aStack_250.listValue.reader.step._2_2_;
      field_00.proto._reader._36_4_ = aStack_250._52_4_;
      field_00.proto._reader.dataSize = aStack_250.listValue.reader.structDataSize;
      uStack_1c9 = aStack_250._56_8_;
      local_1e1 = aStack_250.listValue.reader.ptr;
      local_208.pointer._7_1_ = (undefined1)aStack_250._16_4_;
      local_208.nestingLimit = (int)(CONCAT44(aStack_250._20_4_,aStack_250._16_4_) >> 8);
      local_208._28_3_ = SUB43((uint)aStack_250._20_4_ >> 8,0);
      local_208.segment._7_1_ = (undefined1)aStack_250.intValue;
      local_208.capTable._0_2_ = (uint16_t)((ulong)aStack_250._0_8_ >> 8);
      local_208.capTable._2_2_ = (undefined2)((ulong)aStack_250._0_8_ >> 0x18);
      local_208.capTable._4_3_ = (undefined3)((ulong)aStack_250._0_8_ >> 0x28);
      local_208.capTable._7_1_ = (undefined1)aStack_250.enumValue.value;
      local_208.pointer._0_7_ = (undefined7)((ulong)uVar2 >> 8);
      local_1b8 = aStack_250.intValue;
      local_198 = aStack_250.listValue.reader.ptr;
      uStack_180 = aStack_250._56_8_;
      field_00._8_8_ = uVar2;
      field_00.parent.super_Schema.raw = (Schema)(Schema)aStack_250.intValue;
      field_00.proto._reader.segment =
           (SegmentReader *)CONCAT44(aStack_250._20_4_,aStack_250._16_4_);
      field_00.proto._reader.data = aStack_250.listValue.reader.ptr;
      field_00.proto._reader._40_8_ = aStack_250._56_8_;
      DynamicStruct::Reader::get((Reader *)&local_258,&local_60,field_00);
      uVar8 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                        ((Reader *)&local_258);
      DynamicValue::Reader::~Reader((Reader *)&local_258);
      if (uVar8 != ordinal) {
        local_178.segment = (SegmentReader *)0x0;
        local_258 = (char *)0x0;
        aStack_250.intValue = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_178,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_178);
      }
    }
    else {
      name_00.content.size_ = 3;
      name_00.content.ptr = "f0";
      StructSchema::getFieldByName((Field *)&local_258,&local_1c0,name_00);
      field_01.proto._reader.segment._2_2_ =
           aStack_250.textValue.super_StringPtr.content.size_._2_2_;
      field_01.proto._reader.segment._0_2_ = aStack_250.enumValue.value;
      field_01.proto._reader.segment._4_4_ =
           aStack_250.textValue.super_StringPtr.content.size_._4_4_;
      field_01.proto._reader.capTable._4_4_ = aStack_250._20_4_;
      field_01.proto._reader.capTable._0_4_ = aStack_250._16_4_;
      field_01.proto._reader.data._4_4_ = aStack_250._28_4_;
      field_01.proto._reader.data._0_4_ = aStack_250.anyPointerValue.reader.nestingLimit;
      field_01.proto._reader.pointerCount = aStack_250.structValue.reader.pointerCount;
      field_01.proto._reader.dataSize = aStack_250.listValue.reader.elementCount;
      field_01.proto._reader._38_2_ = aStack_250.listValue.reader.step._2_2_;
      field_01.proto._reader._44_4_ = aStack_250._52_4_;
      field_01.proto._reader.nestingLimit = aStack_250.listValue.reader.structDataSize;
      field_01._8_8_ = aStack_250.intValue;
      field_01.parent.super_Schema.raw = (Schema)(Schema)local_258;
      field_01.proto._reader.pointers = (WirePointer *)aStack_250.listValue.reader.ptr;
      DynamicStruct::Reader::get(&local_a8,&local_60,field_01);
      local_178.pointer = (WirePointer *)(aStack_250.listValue.reader.ptr + 0x10);
      if (aStack_250.structValue.reader.pointerCount < 3) {
        local_178.pointer = (WirePointer *)0x0;
      }
      if (aStack_250.structValue.reader.pointerCount < 3) {
        uVar12 = 0;
        aStack_250.textValue.super_StringPtr.content.size_._4_4_ = 0;
        aStack_250._16_4_ = 0;
        aStack_250._20_4_ = 0;
        aStack_250.listValue.reader.structDataSize = 0x7fffffff;
      }
      else {
        uVar12 = CONCAT22(aStack_250.textValue.super_StringPtr.content.size_._2_2_,
                          aStack_250.enumValue.value);
      }
      local_178.segment =
           (SegmentReader *)
           CONCAT44(aStack_250.textValue.super_StringPtr.content.size_._4_4_,uVar12);
      local_178.capTable._0_4_ = aStack_250._16_4_;
      local_178.capTable._4_4_ = aStack_250._20_4_;
      local_178.nestingLimit = aStack_250.listValue.reader.structDataSize;
      _::PointerReader::getStruct(&local_120,&local_178,(word *)0x0);
      type_01._reader.capTable = local_120.capTable;
      type_01._reader.segment = local_120.segment;
      type_01._reader.data = local_120.data;
      type_01._reader.pointers = local_120.pointers;
      type_01._reader.dataSize = local_120.dataSize;
      type_01._reader.pointerCount = local_120.pointerCount;
      type_01._reader._38_2_ = local_120._38_2_;
      type_01._reader.nestingLimit = local_120.nestingLimit;
      type_01._reader._44_4_ = local_120._44_4_;
      checkExampleValue(&local_a8,ordinal,type_01,sharedOrdinalCount_01);
      DynamicValue::Reader::~Reader(&local_a8);
    }
  }
  return;
}

Assistant:

void checkExampleValue(DynamicValue::Reader value, uint ordinal, schema::Type::Reader type,
                       uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: KJ_ASSERT(value.as<int32_t>() == ordinal * 47327); break;
    case schema::Type::FLOAT64: KJ_ASSERT(value.as<double>() == ordinal * 313.25); break;
    case schema::Type::INT8: KJ_ASSERT(value.as<int8_t>() == int(ordinal % 256) - 128); break;
    case schema::Type::UINT16: KJ_ASSERT(value.as<uint16_t>() == ordinal * 13); break;
    case schema::Type::BOOL: KJ_ASSERT(value.as<bool>() == (ordinal % 2 == 0)); break;
    case schema::Type::TEXT: KJ_ASSERT(value.as<Text>() == kj::str(ordinal)); break;
    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto structType = structValue.getSchema();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        KJ_ASSERT(structValue.get(*fieldI).as<uint32_t>() == ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        checkExampleValue(structValue.get(field), ordinal,
                          field.getProto().getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto enumerant = KJ_ASSERT_NONNULL(value.as<DynamicEnum>().getEnumerant());
      KJ_ASSERT(enumerant.getIndex() ==
          ordinal % enumerant.getContainingEnum().getEnumerants().size());
      break;
    }
    case schema::Type::LIST:
      checkExampleValue(value.as<DynamicList>()[0], ordinal, type.getList().getElementType(),
                        sharedOrdinalCount);
      break;
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }